

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O3

bool __thiscall
OpenMD::
OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
::operator()(OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (data->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + data->_M_string_length);
  bVar2 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
          ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                        *)(this + 0x20),&local_50);
  bVar3 = true;
  if (!bVar2) {
    pcVar1 = (data->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + data->_M_string_length);
    bVar3 = EqualIgnoreCaseConstraint::operator()
                      ((EqualIgnoreCaseConstraint *)(this + 0x120),&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool operator()(DataType data) const {
      return cons1_(data) || cons2_(data);
    }